

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMRangeImpl.cpp
# Opt level: O0

XMLSize_t __thiscall xercesc_4_0::DOMRangeImpl::getStartOffset(DOMRangeImpl *this)

{
  DOMException *this_00;
  DOMRangeImpl *this_local;
  
  if ((this->fDetached & 1U) != 0) {
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    DOMException::DOMException(this_00,0xb,0,this->fMemoryManager);
    __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
  }
  return this->fStartOffset;
}

Assistant:

XMLSize_t DOMRangeImpl::getStartOffset() const
{
    if (fDetached)
    {
        throw DOMException(
            DOMException::INVALID_STATE_ERR, 0, fMemoryManager);
    }

    return fStartOffset;
}